

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_iq4_nl_impl
               (int super_block_size,int block_size,float *x,ggml_fp16_t *dh,uint8_t *q4,
               uint16_t *scales_h,uint8_t *scales_l,float *scales,float *weight,uint8_t *L,
               int8_t *values,float *quant_weights,int ntry)

{
  char cVar1;
  byte bVar2;
  ggml_fp16_t gVar3;
  int iVar4;
  long lVar5;
  ggml_fp16_t *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  void *in_R8;
  void *in_R9;
  float fVar6;
  float fVar7;
  long in_stack_00000008;
  float *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int8_t *in_stack_00000028;
  long in_stack_00000030;
  int in_stack_00000038;
  int j_8;
  int i;
  int j_7;
  float id_2;
  uint8_t l_h;
  uint8_t l_l;
  int j_6;
  float *xb_1;
  uint8_t *Lb_1;
  float idl;
  float dl;
  int l_2;
  int ib_1;
  float id_1;
  float d_1;
  int nb;
  float abs_d;
  float w_1;
  float q_1;
  int l_1;
  float al_1;
  int j_5;
  int itry;
  float best;
  float w;
  float q;
  int l;
  float al;
  int j_4;
  float sumq2;
  float sumqx;
  float id;
  float d;
  float ax;
  int j_3;
  float max;
  float amax;
  int j_2;
  int j_1;
  float *qw;
  uint8_t *Lb;
  float *xb;
  int ib;
  float amax_scale;
  float max_scale;
  int j;
  float sigma2;
  float local_144;
  float in_stack_fffffffffffffee4;
  int local_118;
  int local_114;
  int local_110;
  float local_108;
  float local_104;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_e4;
  int local_c4;
  int local_a0;
  int local_9c;
  float local_98;
  undefined1 local_8c;
  int local_84;
  float local_80;
  float local_7c;
  float local_74;
  int local_6c;
  float local_68;
  float local_64;
  int local_60;
  int local_5c;
  int local_3c;
  float local_38;
  float local_34;
  int local_30;
  float local_2c;
  
  local_2c = 0.0;
  for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
    local_2c = *(float *)(in_RDX + (long)local_30 * 4) * *(float *)(in_RDX + (long)local_30 * 4) +
               local_2c;
  }
  memset(in_R8,0,(long)(in_EDI / 2));
  gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffee4);
  *in_RCX = gVar3;
  local_34 = 0.0;
  local_38 = 0.0;
  for (local_3c = 0; local_3c < in_EDI / in_ESI; local_3c = local_3c + 1) {
    lVar5 = in_RDX + (long)(local_3c * in_ESI) * 4;
    if (in_stack_00000030 == 0) {
      for (local_60 = 0; local_60 < in_ESI; local_60 = local_60 + 1) {
        *(float *)(in_stack_00000018 + (long)local_60 * 4) =
             *(float *)(lVar5 + (long)local_60 * 4) * *(float *)(lVar5 + (long)local_60 * 4);
      }
    }
    else {
      for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
        fVar7 = *(float *)(in_stack_00000030 + (long)(local_3c * in_ESI) * 4 + (long)local_5c * 4);
        fVar6 = sqrtf(*(float *)(lVar5 + (long)local_5c * 4) *
                      *(float *)(lVar5 + (long)local_5c * 4) + (2.0 / (float)in_EDI) * local_2c);
        *(float *)(in_stack_00000018 + (long)local_5c * 4) = fVar7 * fVar6;
      }
    }
    local_64 = 0.0;
    local_68 = 0.0;
    for (local_6c = 0; local_6c < in_ESI; local_6c = local_6c + 1) {
      fVar7 = ABS(*(float *)(lVar5 + (long)local_6c * 4));
      if (local_64 < fVar7) {
        local_68 = *(float *)(lVar5 + (long)local_6c * 4);
        local_64 = fVar7;
      }
    }
    if (1e-15 <= local_64) {
      if (in_stack_00000038 < 1) {
        local_104 = local_68 / (float)(int)*in_stack_00000028;
      }
      else {
        local_104 = -local_68 / (float)(int)*in_stack_00000028;
      }
      local_7c = 0.0;
      local_80 = 0.0;
      for (local_84 = 0; local_84 < in_ESI; local_84 = local_84 + 1) {
        iVar4 = best_index_int8(0x10,in_stack_00000028,
                                (1.0 / local_104) * *(float *)(lVar5 + (long)local_84 * 4));
        local_8c = (undefined1)iVar4;
        *(undefined1 *)(in_stack_00000020 + local_3c * in_ESI + (long)local_84) = local_8c;
        fVar6 = (float)(int)in_stack_00000028[iVar4];
        fVar7 = *(float *)(in_stack_00000018 + (long)local_84 * 4);
        local_7c = fVar7 * fVar6 * *(float *)(lVar5 + (long)local_84 * 4) + local_7c;
        local_80 = fVar7 * fVar6 * fVar6 + local_80;
      }
      local_74 = local_7c / local_80;
      local_98 = local_74 * local_7c;
      for (local_9c = -in_stack_00000038; local_9c <= in_stack_00000038; local_9c = local_9c + 1) {
        cVar1 = *in_stack_00000028;
        local_80 = 0.0;
        local_7c = 0.0;
        for (local_a0 = 0; local_a0 < in_ESI; local_a0 = local_a0 + 1) {
          iVar4 = best_index_int8(0x10,in_stack_00000028,
                                  ((float)(local_9c + cVar1) / local_68) *
                                  *(float *)(lVar5 + (long)local_a0 * 4));
          fVar6 = (float)(int)in_stack_00000028[iVar4];
          fVar7 = *(float *)(in_stack_00000018 + (long)local_a0 * 4);
          local_7c = fVar7 * fVar6 * *(float *)(lVar5 + (long)local_a0 * 4) + local_7c;
          local_80 = fVar7 * fVar6 * fVar6 + local_80;
        }
        if ((0.0 < local_80) && (local_98 * local_80 < local_7c * local_7c)) {
          local_74 = local_7c / local_80;
          local_98 = local_74 * local_7c;
        }
      }
      in_stack_00000010[local_3c] = local_74;
      if (local_38 < ABS(local_74)) {
        local_34 = local_74;
        local_38 = ABS(local_74);
      }
    }
    else {
      in_stack_00000010[local_3c] = 0.0;
    }
  }
  if (in_EDI / in_ESI < 2) {
    gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffee4);
    *in_RCX = gVar3;
    if (0 < in_stack_00000038) {
      if ((*in_stack_00000010 != 0.0) || (NAN(*in_stack_00000010))) {
        local_144 = 1.0 / *in_stack_00000010;
      }
      else {
        local_144 = 0.0;
      }
      for (local_f0 = 0; local_f0 < in_EDI; local_f0 = local_f0 + 1) {
        iVar4 = best_index_int8(0x10,in_stack_00000028,
                                local_144 * *(float *)(in_RDX + (long)local_f0 * 4));
        *(char *)(in_stack_00000020 + local_f0) = (char)iVar4;
      }
    }
  }
  else {
    memset(in_R9,0,(long)((in_EDI / in_ESI + 7) / 8) << 1);
    fVar7 = -local_34 / 32.0;
    gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffee4);
    *in_RCX = gVar3;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      local_108 = 1.0 / fVar7;
    }
    else {
      local_108 = 0.0;
    }
    for (local_c4 = 0; local_c4 < in_EDI / in_ESI; local_c4 = local_c4 + 1) {
      local_118 = nearest_int(local_108 * in_stack_00000010[local_c4]);
      local_110 = local_118;
      if (0x1f < local_118) {
        local_110 = 0x1f;
      }
      if (local_110 < -0x20) {
        local_114 = -0x20;
      }
      else {
        if (0x1f < local_118) {
          local_118 = 0x1f;
        }
        local_114 = local_118;
      }
      fVar6 = fVar7 * (float)local_114;
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        fVar6 = 1.0 / fVar6;
      }
      else {
        fVar6 = 0.0;
      }
      for (local_e4 = 0; local_e4 < in_ESI; local_e4 = local_e4 + 1) {
        iVar4 = best_index_int8(0x10,in_stack_00000028,
                                fVar6 * *(float *)(in_RDX + (long)(local_c4 * in_ESI) * 4 +
                                                  (long)local_e4 * 4));
        *(char *)(in_stack_00000020 + local_c4 * in_ESI + (long)local_e4) = (char)iVar4;
      }
      bVar2 = (byte)(local_114 + 0x20) & 0xf;
      if (local_c4 % 2 == 0) {
        *(byte *)(in_stack_00000008 + local_c4 / 2) = bVar2;
      }
      else {
        *(byte *)(in_stack_00000008 + local_c4 / 2) =
             *(byte *)(in_stack_00000008 + local_c4 / 2) | bVar2 << 4;
      }
      *(ushort *)((long)in_R9 + (long)(local_c4 / 8) * 2) =
           *(ushort *)((long)in_R9 + (long)(local_c4 / 8) * 2) |
           (ushort)(byte)(local_114 + 0x20 >> 4) << ((byte)(local_c4 % 8 << 1) & 0x1f);
    }
  }
  for (local_f4 = 0; local_f4 < in_EDI / 0x20; local_f4 = local_f4 + 1) {
    for (local_f8 = 0; local_f8 < 0x10; local_f8 = local_f8 + 1) {
      *(byte *)((long)in_R8 + (long)(local_f4 * 0x10 + local_f8)) =
           *(byte *)(in_stack_00000020 + (local_f4 * 0x20 + local_f8)) |
           *(char *)(in_stack_00000020 + (local_f4 * 0x20 + 0x10 + local_f8)) << 4;
    }
  }
  return;
}

Assistant:

static void quantize_row_iq4_nl_impl(const int super_block_size, const int block_size, const float * GGML_RESTRICT x,
        ggml_fp16_t * dh, uint8_t * q4, uint16_t * scales_h, uint8_t * scales_l,
        float * scales, float * weight, uint8_t * L,
        const int8_t * values,
        const float * quant_weights,
        const int ntry) {

    float sigma2 = 0;
    for (int j = 0; j < super_block_size; ++j) sigma2 += x[j]*x[j];
    sigma2 *= 2.f/super_block_size;

    memset(q4, 0, super_block_size/2);
    dh[0] = GGML_FP32_TO_FP16(0.f);

    float max_scale = 0, amax_scale = 0;
    for (int ib = 0; ib < super_block_size/block_size; ++ib) {
        const float * xb = x + ib*block_size;
        uint8_t * Lb = L + ib*block_size;
        if (quant_weights) {
            const float * qw = quant_weights + ib*block_size;
            for (int j = 0; j < block_size; ++j) weight[j] = qw[j] * sqrtf(sigma2 + xb[j]*xb[j]);
        } else {
            for (int j = 0; j < block_size; ++j) weight[j] = xb[j]*xb[j];
        }
        float amax = 0, max = 0;
        for (int j = 0; j < block_size; ++j) {
            float ax = fabsf(xb[j]);
            if (ax > amax) {
                amax = ax; max = xb[j];
            }
        }
        if (amax < GROUP_MAX_EPS) {
            scales[ib] = 0;
            continue;
        }
        float d = ntry > 0 ? -max/values[0] : max/values[0];
        float id = 1/d;
        float sumqx = 0, sumq2 = 0;
        for (int j = 0; j < block_size; ++j) {
            float al = id*xb[j];
            int l = best_index_int8(16, values, al);
            Lb[j] = l;
            float q = values[l];
            float w = weight[j];
            sumqx += w*q*xb[j];
            sumq2 += w*q*q;
        }
        d = sumqx/sumq2;
        float best = d*sumqx;
        for (int itry = -ntry; itry <= ntry; ++itry) {
            id = (itry + values[0])/max;
            sumqx = sumq2 = 0;
            for (int j = 0; j < block_size; ++j) {
                float al = id*xb[j];
                int l = best_index_int8(16, values, al);
                float q = values[l];
                float w = weight[j];
                sumqx += w*q*xb[j];
                sumq2 += w*q*q;
            }
            if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                d = sumqx/sumq2; best = d * sumqx;
            }
        }
        scales[ib] = d;
        float abs_d = fabsf(d);
        if (abs_d > amax_scale) {
            amax_scale = abs_d; max_scale = d;
        }
    }

    if (super_block_size/block_size > 1) {
        int nb = super_block_size/block_size;
        memset(scales_h, 0, ((nb+7)/8)*sizeof(uint16_t));
        float d = -max_scale/32;
        dh[0] = GGML_FP32_TO_FP16(d);
        float id = d ? 1/d : 0.f;
        for (int ib = 0; ib < super_block_size/block_size; ++ib) {
            int l = nearest_int(id*scales[ib]);
            l = MAX(-32, MIN(31, l));
            float dl = d * l;
            float idl = dl ? 1/dl : 0.f;
            uint8_t * Lb = L + ib*block_size;
            const float * xb = x + ib*block_size;
            for (int j = 0; j < block_size; ++j) {
                Lb[j] = best_index_int8(16, values, idl*xb[j]);
            }
            l += 32;
            uint8_t l_l = l & 0xf;
            uint8_t l_h = l >>  4;
            if (ib%2 == 0) scales_l[ib/2] = l_l;
            else scales_l[ib/2] |= (l_l << 4);
            scales_h[ib/8] |= (l_h << 2*(ib%8));
        }
    } else {
        dh[0] = GGML_FP32_TO_FP16(scales[0]);
        if (ntry > 0) {
            float id = scales[0] ? 1/scales[0] : 0;
            for (int j = 0; j < super_block_size; ++j) {
                L[j] = best_index_int8(16, values, id*x[j]);
            }
        }
    }

    for (int i = 0; i < super_block_size/32; ++i) {
        for (int j = 0; j < 16; ++j) {
            q4[16*i + j] = L[32*i + j] | (L[32*i + 16 + j] << 4);
        }
    }
}